

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

int Gia_ManPrintEdges(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_local;
  
  printf("Edges (Q=2)    :                ");
  iVar1 = Vec_IntCountPositive(p->vEdge1);
  iVar2 = Vec_IntCountPositive(p->vEdge2);
  printf("edge =%8d  ",(long)(iVar1 + iVar2) / 2 & 0xffffffff,(long)(iVar1 + iVar2) % 2 & 0xffffffff
        );
  iVar1 = Gia_ManEvalEdgeDelay(p);
  printf("lev =%5.1f",(double)iVar1 * 0.1);
  printf("\n");
  return 0;
}

Assistant:

int Gia_ManPrintEdges( Gia_Man_t * p )
{
    printf( "Edges (Q=2)    :                " );
    printf( "edge =%8d  ", (Vec_IntCountPositive(p->vEdge1) + Vec_IntCountPositive(p->vEdge2))/2 );
    printf( "lev =%5.1f",  0.1*Gia_ManEvalEdgeDelay(p) );
    printf( "\n" );
    return 0;
}